

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O3

void __thiscall BackgroundParser::JobProcessed(BackgroundParser *this,Job *job,bool succeeded)

{
  uint uVar1;
  uint uVar2;
  CompileScriptException *pCVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  BackgroundParseItem *pBVar7;
  BackgroundParseItem **ppBVar8;
  undefined4 *puVar9;
  BackgroundParseItem *pBVar10;
  
  if (this->unprocessedItemsHead == (BackgroundParseItem *)job) {
    pBVar7 = *(BackgroundParseItem **)&job[3].isCritical;
    this->unprocessedItemsHead = pBVar7;
    pBVar10 = (BackgroundParseItem *)
              job[4].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous;
  }
  else {
    pBVar7 = *(BackgroundParseItem **)&job[3].isCritical;
    pBVar10 = (BackgroundParseItem *)
              job[4].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous;
    pBVar10->nextUnprocessedItem = pBVar7;
  }
  ppBVar8 = &pBVar7->prevUnprocessedItem;
  if (this->unprocessedItemsTail == (BackgroundParseItem *)job) {
    ppBVar8 = &this->unprocessedItemsTail;
  }
  *ppBVar8 = pBVar10;
  job[3].isCritical = false;
  *(undefined3 *)&job[3].field_0x19 = 0;
  job[3].failureReason = NotFailed;
  job[4].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous = (Type)0x0;
  this->pendingBackgroundItems = this->pendingBackgroundItems - 1;
  if (!succeeded) {
    iVar6 = *(int *)&job[5].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.
                     previous;
    if ((-1 < iVar6) && (this->failedBackgroundParseItem == (BackgroundParseItem *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BackgroundParser.cpp"
                         ,0x76,
                         "(((HRESULT)(backgroundItem->GetHR())<0) || failedBackgroundParseItem)",
                         "FAILED(backgroundItem->GetHR()) || failedBackgroundParseItem");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
      iVar6 = *(int *)&job[5].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.
                       previous;
    }
    if (iVar6 < 0) {
      if (this->failedBackgroundParseItem != (BackgroundParseItem *)0x0) {
        pCVar3 = this->failedBackgroundParseItem->pse;
        uVar1 = pCVar3->line;
        uVar2 = job[4].manager[1].numJobsAddedToProcessor;
        if ((int)uVar1 <= (int)uVar2) {
          if (uVar2 != uVar1) {
            return;
          }
          if (pCVar3->ichMinLine <= *(int *)&job[4].manager[1].isWaitable) {
            return;
          }
        }
      }
      this->failedBackgroundParseItem = (BackgroundParseItem *)job;
    }
  }
  return;
}

Assistant:

void BackgroundParser::JobProcessed(JsUtil::Job *const job, const bool succeeded)
{
    // This is called from inside a lock, so we can mess with background parser attributes.
    BackgroundParseItem *backgroundItem = static_cast<BackgroundParseItem*>(job);
    this->RemoveFromUnprocessedItems(backgroundItem);
    --this->pendingBackgroundItems;
    if (!succeeded)
    {
        Assert(FAILED(backgroundItem->GetHR()) || failedBackgroundParseItem);

        if (FAILED(backgroundItem->GetHR()))
        {
            if (!failedBackgroundParseItem)
            {
                failedBackgroundParseItem = backgroundItem;
            }
            else
            {
                // If syntax errors are detected on multiple threads, the lexically earlier one should win.
                CompileScriptException *newPse = backgroundItem->GetPSE();
                CompileScriptException *oldPse = failedBackgroundParseItem->GetPSE();

                if (newPse->line < oldPse->line ||
                    (newPse->line == oldPse->line && newPse->ichMinLine < oldPse->ichMinLine))
                {
                    failedBackgroundParseItem = backgroundItem;
                }
            }
        }
    }
}